

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int lyxp_node_check_syntax(lys_node *node)

{
  LYS_NODE LVar1;
  ushort uVar2;
  int iVar3;
  ulong in_RAX;
  lys_node *plVar4;
  lyxp_expr *exp;
  char *pcVar5;
  long lVar6;
  byte bVar7;
  undefined8 uStack_38;
  uint16_t exp_idx;
  
  LVar1 = node->nodetype;
  pcVar5 = (char *)0x0;
  bVar7 = 0;
  uStack_38 = in_RAX;
  switch(LVar1) {
  case LYS_CONTAINER:
    plVar4 = node + 1;
    pcVar5 = node[1].dsc;
    bVar7 = node->padding[2];
    break;
  case LYS_CHOICE:
    goto switchD_0016188e_caseD_2;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    goto switchD_0016188e_caseD_3;
  case LYS_LEAF:
  case LYS_LEAFLIST:
switchD_0016188e_caseD_4:
    plVar4 = node + 1;
    pcVar5 = node[1].dsc;
    bVar7 = node->padding[3];
    break;
  default:
    if (LVar1 == LYS_LIST) {
      plVar4 = node + 1;
      pcVar5 = node[1].dsc;
      bVar7 = node->padding[0];
      break;
    }
    if (LVar1 == LYS_ANYXML) goto switchD_0016188e_caseD_4;
    if (LVar1 == LYS_CASE) {
switchD_0016188e_caseD_2:
      plVar4 = node + 1;
LAB_001618ce:
      bVar7 = 0;
      pcVar5 = (char *)0x0;
      break;
    }
    if (((LVar1 != LYS_NOTIF) && (LVar1 != LYS_INPUT)) && (LVar1 != LYS_OUTPUT)) {
      if (LVar1 == LYS_USES) goto switchD_0016188e_caseD_2;
      if (LVar1 != LYS_AUGMENT) {
        bVar7 = 0;
        if (LVar1 == LYS_ANYDATA) goto switchD_0016188e_caseD_4;
        goto switchD_0016188e_caseD_3;
      }
      plVar4 = (lys_node *)&node->next;
      goto LAB_001618ce;
    }
    pcVar5 = node[1].dsc;
    bVar7 = node->padding[3];
    goto switchD_0016188e_caseD_3;
  }
  if (plVar4->name == (char *)0x0) {
switchD_0016188e_caseD_3:
    for (lVar6 = 0; (ulong)bVar7 * 0x38 - lVar6 != 0; lVar6 = lVar6 + 0x38) {
      exp = lyxp_parse_expr(*(char **)(pcVar5 + lVar6));
      if (exp == (lyxp_expr *)0x0) {
        return -1;
      }
      uStack_38 = uStack_38 & 0xffffffffffff;
      iVar3 = reparse_expr(exp,(uint16_t *)((long)&uStack_38 + 6));
      if (iVar3 != 0) goto LAB_001619b0;
      uVar2 = uStack_38._6_2_;
      if (uStack_38._6_2_ != exp->used) goto LAB_00161984;
      lyxp_expr_free(exp);
    }
    iVar3 = 0;
  }
  else {
    exp = lyxp_parse_expr(*(char **)plVar4->name);
    if (exp == (lyxp_expr *)0x0) {
      return -1;
    }
    uStack_38 = uStack_38 & 0xffffffffffff;
    iVar3 = reparse_expr(exp,(uint16_t *)((long)&uStack_38 + 6));
    if (iVar3 == 0) {
      uVar2 = uStack_38._6_2_;
      if (uStack_38._6_2_ == exp->used) {
        lyxp_expr_free(exp);
        goto switchD_0016188e_caseD_3;
      }
LAB_00161984:
      pcVar5 = print_token(exp->tokens[uVar2]);
      ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,pcVar5,exp->expr + exp->expr_pos[uVar2]);
    }
LAB_001619b0:
    iVar3 = -1;
    lyxp_expr_free(exp);
  }
  return iVar3;
}

Assistant:

int
lyxp_node_check_syntax(const struct lys_node *node)
{
    uint8_t must_size = 0;
    uint16_t exp_idx;
    uint32_t i;
    struct lys_when *when = NULL;
    struct lys_restr *must = NULL;
    struct lyxp_expr *expr;

    switch (node->nodetype) {
    case LYS_CONTAINER:
        when = ((struct lys_node_container *)node)->when;
        must = ((struct lys_node_container *)node)->must;
        must_size = ((struct lys_node_container *)node)->must_size;
        break;
    case LYS_CHOICE:
        when = ((struct lys_node_choice *)node)->when;
        break;
    case LYS_LEAF:
        when = ((struct lys_node_leaf *)node)->when;
        must = ((struct lys_node_leaf *)node)->must;
        must_size = ((struct lys_node_leaf *)node)->must_size;
        break;
    case LYS_LEAFLIST:
        when = ((struct lys_node_leaflist *)node)->when;
        must = ((struct lys_node_leaflist *)node)->must;
        must_size = ((struct lys_node_leaflist *)node)->must_size;
        break;
    case LYS_LIST:
        when = ((struct lys_node_list *)node)->when;
        must = ((struct lys_node_list *)node)->must;
        must_size = ((struct lys_node_list *)node)->must_size;
        break;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        when = ((struct lys_node_anydata *)node)->when;
        must = ((struct lys_node_anydata *)node)->must;
        must_size = ((struct lys_node_anydata *)node)->must_size;
        break;
    case LYS_CASE:
        when = ((struct lys_node_case *)node)->when;
        break;
    case LYS_NOTIF:
        must = ((struct lys_node_notif *)node)->must;
        must_size = ((struct lys_node_notif *)node)->must_size;
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        must = ((struct lys_node_inout *)node)->must;
        must_size = ((struct lys_node_inout *)node)->must_size;
        break;
    case LYS_USES:
        when = ((struct lys_node_uses *)node)->when;
        break;
    case LYS_AUGMENT:
        when = ((struct lys_node_augment *)node)->when;
        break;
    default:
        /* nothing to check */
        break;
    }

    /* check "when" */
    if (when) {
        expr = lyxp_parse_expr(when->cond);
        if (!expr) {
            return -1;
        }

        exp_idx = 0;
        if (reparse_expr(expr, &exp_idx)) {
            lyxp_expr_free(expr);
            return -1;
        } else if (exp_idx != expr->used) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, print_token(expr->tokens[exp_idx]), &expr->expr[expr->expr_pos[exp_idx]]);
            lyxp_expr_free(expr);
            return -1;
        }
        lyxp_expr_free(expr);
    }

    /* check "must" */
    for (i = 0; i < must_size; ++i) {
        expr = lyxp_parse_expr(must[i].expr);
        if (!expr) {
            return -1;
        }

        exp_idx = 0;
        if (reparse_expr(expr, &exp_idx)) {
            lyxp_expr_free(expr);
            return -1;
        } else if (exp_idx != expr->used) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, print_token(expr->tokens[exp_idx]), &expr->expr[expr->expr_pos[exp_idx]]);
            lyxp_expr_free(expr);
            return -1;
        }
        lyxp_expr_free(expr);
    }

    return 0;
}